

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  uint __fd;
  uv_loop_t *puVar2;
  char *unaff_RBX;
  uv_pipe_t *loop;
  size_t len;
  char buf [1024];
  size_t sStack_8a8;
  sockaddr sStack_8a0;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined6 uStack_848;
  undefined2 uStack_842;
  undefined6 uStack_840;
  undefined8 uStack_83a;
  undefined3 uStack_830;
  undefined5 uStack_82d;
  undefined3 uStack_828;
  char *pcStack_428;
  undefined8 local_410;
  char local_408 [1024];
  
  if (req == &connect_req) {
    if (status != 0) goto LAB_001632c4;
    local_410 = 0x400;
    unaff_RBX = local_408;
    iVar1 = uv_pipe_getpeername(&pipe_client,unaff_RBX,&local_410);
    if (iVar1 != 0) goto LAB_001632c9;
    if (unaff_RBX[local_410 - 1] == '\0') goto LAB_001632ce;
    iVar1 = bcmp(local_408,"/tmp/uv-test-sock",local_410);
    if (iVar1 != 0) goto LAB_001632d3;
    local_410 = 0x400;
    iVar1 = uv_pipe_getsockname(&pipe_client,local_408,&local_410);
    if ((iVar1 == 0) && (local_410 == 0)) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return;
    }
  }
  else {
    pipe_client_connect_cb_cold_1();
LAB_001632c4:
    pipe_client_connect_cb_cold_2();
LAB_001632c9:
    pipe_client_connect_cb_cold_3();
LAB_001632ce:
    pipe_client_connect_cb_cold_6();
LAB_001632d3:
    pipe_client_connect_cb_cold_4();
  }
  pipe_client_connect_cb_cold_5();
  loop = (uv_pipe_t *)0x1;
  pcStack_428 = unaff_RBX;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016344b:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163450:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163455:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016345a:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_0016345f:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    sStack_8a0.sa_data[0xb] = '\0';
    sStack_8a0.sa_data[0xc] = '\0';
    sStack_8a0.sa_data[0xd] = '\0';
    uStack_840 = 0;
    uStack_83a = 0;
    uStack_850 = 0;
    uStack_848 = 0;
    uStack_842 = 0;
    uStack_860 = 0;
    uStack_858 = 0;
    uStack_870 = 0;
    uStack_868 = 0;
    uStack_880 = 0;
    uStack_878 = 0;
    uStack_890 = 0;
    uStack_888 = 0;
    sStack_8a0.sa_family = 1;
    sStack_8a0.sa_data[0] = '\0';
    sStack_8a0.sa_data[1] = 't';
    sStack_8a0.sa_data[2] = 'e';
    sStack_8a0.sa_data[3] = 's';
    sStack_8a0.sa_data[4] = 't';
    sStack_8a0.sa_data[5] = '-';
    sStack_8a0.sa_data[6] = 'p';
    sStack_8a0.sa_data[7] = 'i';
    sStack_8a0.sa_data[8] = 'p';
    sStack_8a0.sa_data[9] = 'e';
    sStack_8a0.sa_data[10] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,&sStack_8a0,0x6e);
    if (iVar1 != 0) goto LAB_0016344b;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163450;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163455;
    sStack_8a8 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&uStack_830,&sStack_8a8);
    if (iVar1 != 0) goto LAB_0016345a;
    if (CONCAT35(uStack_828,uStack_82d) != 0x657069702d7473 ||
        CONCAT53(uStack_82d,uStack_830) != 0x69702d7473657400) goto LAB_0016345f;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00163469;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_00163469:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return;
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return;
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;


  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}